

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_add_range(void **param_1)

{
  char *pcVar1;
  bool bVar2;
  reference ppVar3;
  char *expression;
  uint64_t v;
  Roaring r2;
  Roaring r1;
  uint64_t max;
  uint64_t min;
  pair<unsigned_long,_unsigned_long> *range;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ranges;
  pair<unsigned_long,_unsigned_long> *this;
  Roaring *this_00;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffef0;
  allocator_type *in_stack_ffffffffffffff08;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff10;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> in_stack_ffffffffffffff18;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_a0;
  undefined1 *local_98;
  undefined1 local_79 [41];
  pair<unsigned_long,_unsigned_long> local_50;
  pair<unsigned_long,_unsigned_long> local_40;
  pair<unsigned_long,_unsigned_long> *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_79._21_4_ = 1;
  local_79._17_4_ = 5;
  this = (pair<unsigned_long,_unsigned_long> *)(local_79 + 0x19);
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (this,(int *)(local_79 + 0x15),(int *)(local_79 + 0x11));
  local_79._13_4_ = 1;
  local_79._9_4_ = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_50,(int *)(local_79 + 0xd),(int *)(local_79 + 9));
  local_79._5_4_ = 2;
  local_79._1_4_ = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_40,(int *)(local_79 + 5),(int *)(local_79 + 1));
  local_28 = 3;
  this_00 = (Roaring *)local_79;
  local_30 = this;
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x108c06);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff08);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x108c37);
  local_98 = local_20;
  local_a0._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::begin(this);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         *)this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)this_00,
                       (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)this);
    if (!bVar2) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator*(&local_a0);
    expression = (char *)ppVar3->first;
    pcVar1 = (char *)ppVar3->second;
    roaring::Roaring::Roaring(this_00);
    roaring::Roaring::addRangeClosed(this_00,(uint32_t)((ulong)this >> 0x20),(uint32_t)this);
    roaring::Roaring::Roaring(this_00);
    for (; expression <= pcVar1; expression = expression + 1) {
      roaring::Roaring::add(this_00,(uint32_t)((ulong)this >> 0x20));
    }
    roaring::Roaring::operator==(this_00,(Roaring *)this);
    _assert_true((unsigned_long)in_stack_fffffffffffffef0,expression,(char *)this_00,
                 (int)((ulong)this >> 0x20));
    roaring::Roaring::~Roaring(this_00);
    roaring::Roaring::~Roaring(this_00);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(&local_a0);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector(in_stack_fffffffffffffef0);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_range) {
    std::vector<std::pair<uint64_t, uint64_t>> ranges = {
        {1, 5},
        {1, 1},
        {2, 1},
    };
    for (const auto &range : ranges) {
        uint64_t min = range.first;
        uint64_t max = range.second;
        Roaring r1;
        r1.addRangeClosed(min, max);
        Roaring r2;
        for (uint64_t v = min; v <= max; ++v) {
            r2.add(v);
        }
        assert_true(r1 == r2);
    }
}